

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.h
# Opt level: O0

format_arg * __thiscall
fmt::v5::
basic_format_args<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
::get(format_arg *__return_storage_ptr__,
     basic_format_args<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
     *this,size_type index)

{
  named_arg_base<char> *this_00;
  format_arg *arg;
  undefined8 local_30;
  type local_28;
  size_type local_14;
  basic_format_args<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
  *pbStack_10;
  size_type index_local;
  basic_format_args<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
  *this_local;
  
  local_14 = index;
  pbStack_10 = this;
  do_get(__return_storage_ptr__,this,index);
  if (__return_storage_ptr__->type_ == named_arg_type) {
    this_00 = internal::
              value<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
              ::as_named_arg(&__return_storage_ptr__->value_);
    internal::named_arg_base<char>::
    deserialize<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>
              ((basic_format_arg<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
                *)&arg,this_00);
    (__return_storage_ptr__->value_).field_0.pointer = arg;
    (__return_storage_ptr__->value_).field_0.string.size = local_30;
    __return_storage_ptr__->type_ = local_28;
  }
  return __return_storage_ptr__;
}

Assistant:

format_arg get(size_type index) const {
    format_arg arg = do_get(index);
    if (arg.type_ == internal::named_arg_type)
      arg = arg.value_.as_named_arg().template deserialize<Context>();
    return arg;
  }